

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_column_writer.cpp
# Opt level: O3

void __thiscall
duckdb::FixedDecimalColumnWriter::WriteVector
          (FixedDecimalColumnWriter *this,WriteStream *temp_writer,ColumnWriterStatistics *stats_p,
          ColumnWriterPageState *page_state,Vector *input_column,idx_t chunk_start,idx_t chunk_end)

{
  idx_t r;
  hugeint_t *val;
  hugeint_t input;
  undefined1 auStack_48 [24];
  
  FlatVector::VerifyFlatVector(input_column);
  if (chunk_start < chunk_end) {
    val = (hugeint_t *)(chunk_start * 0x10 + *(long *)(input_column + 0x20));
    do {
      if ((*(long *)(input_column + 0x28) == 0) ||
         (page_state = (ColumnWriterPageState *)(chunk_start >> 6),
         (*(ulong *)(*(long *)(input_column + 0x28) + (long)page_state * 8) >> (chunk_start & 0x3f)
         & 1) != 0)) {
        FixedDecimalStatistics::Update((FixedDecimalStatistics *)stats_p,val);
        input.upper = (int64_t)auStack_48;
        input.lower = val->upper;
        WriteParquetDecimal((duckdb *)val->lower,input,(data_ptr_t)page_state);
        (*(code *)**(undefined8 **)temp_writer)(temp_writer,auStack_48,0x10);
      }
      chunk_start = chunk_start + 1;
      val = val + 1;
    } while (chunk_end != chunk_start);
  }
  return;
}

Assistant:

void FixedDecimalColumnWriter::WriteVector(WriteStream &temp_writer, ColumnWriterStatistics *stats_p,
                                           ColumnWriterPageState *page_state, Vector &input_column, idx_t chunk_start,
                                           idx_t chunk_end) {
	auto &mask = FlatVector::Validity(input_column);
	auto *ptr = FlatVector::GetData<hugeint_t>(input_column);
	auto &stats = stats_p->Cast<FixedDecimalStatistics>();

	data_t temp_buffer[16];
	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (mask.RowIsValid(r)) {
			stats.Update(ptr[r]);
			WriteParquetDecimal(ptr[r], temp_buffer);
			temp_writer.WriteData(temp_buffer, 16);
		}
	}
}